

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O1

void __thiscall Potassco::AspifTextInput::matchLits(AspifTextInput *this)

{
  Data *this_00;
  uint uVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  Atom_t AVar5;
  
  bVar2 = ProgramReader::peek(&this->super_ProgramReader,true);
  iVar4 = islower((uint)bVar2);
  if (iVar4 != 0) {
    do {
      this_00 = this->data_;
      bVar3 = match(this,"not ",false);
      AVar5 = matchId(this);
      uVar1 = -AVar5;
      if (!bVar3) {
        uVar1 = AVar5;
      }
      RuleBuilder::addGoal(&this_00->rule,(WeightLit_t)((ulong)uVar1 | 0x100000000));
      bVar3 = match(this,",",false);
    } while (bVar3);
  }
  return;
}

Assistant:

void AspifTextInput::matchLits() {
	if (std::islower(static_cast<unsigned char>(peek(true))) != 0) {
		do {
			data_->rule.addGoal(matchLit());
		} while (match(",", false));
	}
}